

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

void dash_traverse_func(void *closure,plutovg_path_command_t command,plutovg_point_t *points,
                       int npoints)

{
  char cVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  plutovg_point_t pVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 local_58;
  plutovg_point_t p1;
  
  if (command == PLUTOVG_PATH_COMMAND_MOVE_TO) {
    cVar1 = *(char *)((long)closure + 0x1c);
    if (cVar1 == '\x01') {
      (**(code **)((long)closure + 0x28))
                (*(undefined8 *)((long)closure + 0x30),0,points,
                 CONCAT44(in_register_0000000c,npoints));
      cVar1 = *(char *)((long)closure + 0x1c);
    }
    *(plutovg_point_t *)((long)closure + 0x20) = *points;
    *(undefined4 *)((long)closure + 0x10) = *(undefined4 *)((long)closure + 0xc);
    *(undefined4 *)((long)closure + 0x18) = *(undefined4 *)((long)closure + 0x14);
    *(char *)((long)closure + 0x1d) = cVar1;
  }
  else {
    if ((command & ~PLUTOVG_PATH_COMMAND_CUBIC_TO) != PLUTOVG_PATH_COMMAND_LINE_TO) {
      __assert_fail("command == PLUTOVG_PATH_COMMAND_LINE_TO || command == PLUTOVG_PATH_COMMAND_CLOSE"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-path.c"
                    ,0x22b,
                    "void dash_traverse_func(void *, plutovg_path_command_t, const plutovg_point_t *, int)"
                   );
    }
    pVar3 = *points;
    fVar4 = (float)*(undefined8 *)((long)closure + 0x20);
    fVar6 = (float)((ulong)*(undefined8 *)((long)closure + 0x20) >> 0x20);
    fVar7 = pVar3.x - fVar4;
    fVar9 = pVar3.y - fVar6;
    fVar10 = SQRT(fVar7 * fVar7 + fVar9 * fVar9);
    iVar2 = *(int *)((long)closure + 0x18);
    fVar5 = *(float *)((long)closure + 0x10);
    fVar11 = 0.0;
    p1 = pVar3;
    while( true ) {
      fVar12 = fVar10 - fVar11;
      fVar8 = *(float *)(*closure + (long)(iVar2 % *(int *)((long)closure + 8)) * 4) - fVar5;
      if (fVar12 <= fVar8) break;
      fVar11 = fVar11 + fVar8;
      fVar5 = fVar11 / fVar10;
      local_58 = CONCAT44(fVar5 * fVar9 + fVar6,fVar5 * fVar7 + fVar4);
      (**(code **)((long)closure + 0x28))
                (*(undefined8 *)((long)closure + 0x30),*(undefined1 *)((long)closure + 0x1d),
                 &local_58,1);
      *(undefined4 *)((long)closure + 0x10) = 0;
      *(byte *)((long)closure + 0x1d) = *(byte *)((long)closure + 0x1d) ^ 1;
      iVar2 = *(int *)((long)closure + 0x18) + 1;
      *(int *)((long)closure + 0x18) = iVar2;
      fVar5 = 0.0;
    }
    if (*(char *)((long)closure + 0x1d) == '\x01') {
      (**(code **)((long)closure + 0x28))(*(undefined8 *)((long)closure + 0x30),1,&p1);
      fVar5 = *(float *)((long)closure + 0x10);
      pVar3 = p1;
    }
    *(float *)((long)closure + 0x10) = fVar12 + fVar5;
    *(plutovg_point_t *)((long)closure + 0x20) = pVar3;
  }
  return;
}

Assistant:

static void dash_traverse_func(void* closure, plutovg_path_command_t command, const plutovg_point_t* points, int npoints)
{
    dasher_t* dasher = (dasher_t*)(closure);
    if(command == PLUTOVG_PATH_COMMAND_MOVE_TO) {
        if(dasher->start_toggle)
            dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_MOVE_TO, points, npoints);
        dasher->current_point = points[0];
        dasher->phase = dasher->start_phase;
        dasher->index = dasher->start_index;
        dasher->toggle = dasher->start_toggle;
        return;
    }

    assert(command == PLUTOVG_PATH_COMMAND_LINE_TO || command == PLUTOVG_PATH_COMMAND_CLOSE);
    plutovg_point_t p0 = dasher->current_point;
    plutovg_point_t p1 = points[0];
    float dx = p1.x - p0.x;
    float dy = p1.y - p0.y;
    float dist0 = sqrtf(dx*dx + dy*dy);
    float dist1 = 0.f;
    while(dist0 - dist1 > dasher->dashes[dasher->index % dasher->ndashes] - dasher->phase) {
        dist1 += dasher->dashes[dasher->index % dasher->ndashes] - dasher->phase;
        float a = dist1 / dist0;
        plutovg_point_t p = { p0.x + a * dx, p0.y + a * dy };
        if(dasher->toggle) {
            dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_LINE_TO, &p, 1);
        } else {
            dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_MOVE_TO, &p, 1);
        }

        dasher->phase = 0.f;
        dasher->toggle = !dasher->toggle;
        dasher->index++;
    }

    if(dasher->toggle) {
        dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_LINE_TO, &p1, 1);
    }

    dasher->phase += dist0 - dist1;
    dasher->current_point = p1;
}